

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

int __thiscall NNTreeIterator::remove(NNTreeIterator *this,char *__filename)

{
  QPDF *qpdf;
  bool bVar1;
  bool bVar2;
  int extraout_EAX;
  logic_error *plVar3;
  iterator parent_00;
  string *psVar4;
  pointer pPVar5;
  QPDFObjectHandle local_158;
  allocator<char> local_141;
  string local_140;
  _Self local_120;
  QPDFObjectHandle local_118;
  QPDFObjectHandle local_108;
  QPDFObjectHandle local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  QPDFObjectHandle local_d8;
  int local_c8;
  allocator<char> local_c1;
  int nkids;
  undefined1 local_a0 [8];
  QPDFObjectHandle kids;
  iterator parent;
  iterator element;
  bool done;
  QPDFObjectHandle local_70;
  allocator<char> local_59;
  string local_58;
  int local_34;
  undefined1 local_30 [4];
  int nitems;
  QPDFObjectHandle items;
  NNTreeIterator *this_local;
  
  bVar1 = valid(this);
  if (!bVar1) {
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar3,"attempt made to remove an invalid iterator");
    __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  (*(code *)**(undefined8 **)this->impl->details)();
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_30,(string *)&this->node);
  local_34 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_30);
  if (local_34 < this->item_number + 2) {
    qpdf = this->impl->qpdf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"found short items array while removing an item",&local_59);
    ::error(qpdf,&this->node,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_30,this->item_number);
  QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_30,this->item_number);
  local_34 = local_34 + -2;
  if (local_34 < 1) {
    bVar1 = std::__cxx11::
            list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::empty
                      (&this->path);
    if (bVar1) {
      QTC::TC("qpdf","NNTree erased all items on leaf/root",0);
      setItemNumber(this,&this->impl->oh,-1);
    }
    else {
      QTC::TC("qpdf","NNTree items is empty after remove",0);
      bVar1 = false;
      while (!bVar1) {
        kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lastPathElement(this);
        parent._M_node =
             (_List_node_base *)
             kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        std::_List_iterator<NNTreeIterator::PathElement>::operator--
                  ((_List_iterator<NNTreeIterator::PathElement> *)
                   &kids.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        psVar4 = (string *)std::_List_iterator<NNTreeIterator::PathElement>::operator->(&parent);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&nkids,"/Kids",&local_c1);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_a0,psVar4);
        std::__cxx11::string::~string((string *)&nkids);
        std::allocator<char>::~allocator(&local_c1);
        pPVar5 = std::_List_iterator<NNTreeIterator::PathElement>::operator->(&parent);
        QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_a0,pPVar5->kid_number);
        local_c8 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_a0);
        if (local_c8 < 1) {
          local_120._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::end
                         (&this->path);
          bVar2 = std::operator==((_Self *)&kids.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,&local_120);
          if (bVar2) {
            QTC::TC("qpdf","NNTree non-flat tree is empty after remove",0);
            pPVar5 = std::_List_iterator<NNTreeIterator::PathElement>::operator->(&parent);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_140,"/Kids",&local_141);
            QPDFObjectHandle::removeKey(&pPVar5->node,&local_140);
            std::__cxx11::string::~string((string *)&local_140);
            std::allocator<char>::~allocator(&local_141);
            pPVar5 = std::_List_iterator<NNTreeIterator::PathElement>::operator->(&parent);
            psVar4 = (string *)(*(code *)**(undefined8 **)this->impl->details)();
            QPDFObjectHandle::newArray();
            QPDFObjectHandle::replaceKey(&pPVar5->node,psVar4,&local_158);
            QPDFObjectHandle::~QPDFObjectHandle(&local_158);
            std::__cxx11::
            list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::clear
                      (&this->path);
            setItemNumber(this,&this->impl->oh,-1);
            bVar1 = true;
          }
          else {
            QTC::TC("qpdf","NNTree remove walking up tree",0);
            std::__cxx11::
            list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
            pop_back(&this->path);
          }
        }
        else {
          pPVar5 = std::_List_iterator<NNTreeIterator::PathElement>::operator->(&parent);
          if ((pPVar5->kid_number == 0) ||
             (pPVar5 = std::_List_iterator<NNTreeIterator::PathElement>::operator->(&parent),
             pPVar5->kid_number == local_c8)) {
            QTC::TC("qpdf","NNTree erased first or last kid",0);
            pPVar5 = std::_List_iterator<NNTreeIterator::PathElement>::operator->(&parent);
            QPDFObjectHandle::QPDFObjectHandle(&local_d8,&pPVar5->node);
            local_e0 = kids.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            resetLimits(this,&local_d8,
                        (iterator)
                        kids.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       );
            QPDFObjectHandle::~QPDFObjectHandle(&local_d8);
          }
          pPVar5 = std::_List_iterator<NNTreeIterator::PathElement>::operator->(&parent);
          if (pPVar5->kid_number == local_c8) {
            local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            QPDFObjectHandle::QPDFObjectHandle(&local_f8);
            setItemNumber(this,&local_f8,-1);
            QPDFObjectHandle::~QPDFObjectHandle(&local_f8);
            pPVar5 = std::_List_iterator<NNTreeIterator::PathElement>::operator->(&parent);
            pPVar5->kid_number = pPVar5->kid_number + -1;
            std::_List_iterator<NNTreeIterator::PathElement>::operator->(&parent);
            QPDFObjectHandle::getArrayItem(&local_108,(int)local_a0);
            deepen(this,&local_108,false,true);
            QPDFObjectHandle::~QPDFObjectHandle(&local_108);
            bVar1 = valid(this);
            if (bVar1) {
              increment(this,false);
              bVar1 = valid(this);
              if (bVar1) {
                QTC::TC("qpdf","NNTree erased last kid",0);
              }
              else {
                QTC::TC("qpdf","NNTree erased last item in tree",0);
              }
            }
          }
          else {
            QTC::TC("qpdf","NNTree erased non-last kid",0);
            std::_List_iterator<NNTreeIterator::PathElement>::operator->(&parent);
            QPDFObjectHandle::getArrayItem(&local_118,(int)local_a0);
            deepen(this,&local_118,true,true);
            QPDFObjectHandle::~QPDFObjectHandle(&local_118);
          }
          bVar1 = true;
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_a0);
      }
    }
  }
  else {
    if ((this->item_number == 0) || (this->item_number == local_34)) {
      QTC::TC("qpdf","NNTree remove reset limits",0);
      QPDFObjectHandle::QPDFObjectHandle(&local_70,&this->node);
      parent_00 = lastPathElement(this);
      resetLimits(this,&local_70,parent_00);
      QPDFObjectHandle::~QPDFObjectHandle(&local_70);
    }
    if (this->item_number == local_34) {
      QTC::TC("qpdf","NNTree erased last item",0);
      this->item_number = this->item_number + -2;
      increment(this,false);
    }
    else {
      if (local_34 <= this->item_number) {
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar3,"NNTreeIterator::remove: item_number > nitems after erase");
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      QTC::TC("qpdf","NNTree erased non-last item",0);
      updateIValue(this,true);
    }
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  return extraout_EAX;
}

Assistant:

void
NNTreeIterator::remove()
{
    // Remove this item, leaving the tree valid and this iterator pointing to the next item.

    if (!valid()) {
        throw std::logic_error("attempt made to remove an invalid iterator");
    }
    auto items = this->node.getKey(impl.details.itemsKey());
    int nitems = items.getArrayNItems();
    if (this->item_number + 2 > nitems) {
        error(impl.qpdf, this->node, "found short items array while removing an item");
    }

    items.eraseItem(this->item_number);
    items.eraseItem(this->item_number);
    nitems -= 2;

    if (nitems > 0) {
        // There are still items left

        if ((this->item_number == 0) || (this->item_number == nitems)) {
            // We removed either the first or last item of an items array that remains non-empty, so
            // we have to adjust limits.
            QTC::TC("qpdf", "NNTree remove reset limits");
            resetLimits(this->node, lastPathElement());
        }

        if (this->item_number == nitems) {
            // We removed the last item of a non-empty items array, so advance to the successor of
            // the previous item.
            QTC::TC("qpdf", "NNTree erased last item");
            this->item_number -= 2;
            increment(false);
        } else if (this->item_number < nitems) {
            // We don't have to do anything since the removed item's successor now occupies its
            // former location.
            QTC::TC("qpdf", "NNTree erased non-last item");
            updateIValue();
        } else {
            // We already checked to ensure this condition would not happen.
            throw std::logic_error("NNTreeIterator::remove: item_number > nitems after erase");
        }
        return;
    }

    if (this->path.empty()) {
        // Special case: if this is the root node, we can leave it empty.
        QTC::TC("qpdf", "NNTree erased all items on leaf/root");
        setItemNumber(impl.oh, -1);
        return;
    }

    QTC::TC("qpdf", "NNTree items is empty after remove");

    // We removed the last item from this items array, so we need to remove this node from the
    // parent on up the tree. Then we need to position ourselves at the removed item's successor.
    bool done = false;
    while (!done) {
        auto element = lastPathElement();
        auto parent = element;
        --parent;
        auto kids = element->node.getKey("/Kids");
        kids.eraseItem(element->kid_number);
        auto nkids = kids.getArrayNItems();
        if (nkids > 0) {
            // The logic here is similar to the items case.
            if ((element->kid_number == 0) || (element->kid_number == nkids)) {
                QTC::TC("qpdf", "NNTree erased first or last kid");
                resetLimits(element->node, parent);
            }
            if (element->kid_number == nkids) {
                // Move to the successor of the last child of the previous kid.
                setItemNumber(QPDFObjectHandle(), -1);
                --element->kid_number;
                deepen(kids.getArrayItem(element->kid_number), false, true);
                if (valid()) {
                    increment(false);
                    if (!valid()) {
                        QTC::TC("qpdf", "NNTree erased last item in tree");
                    } else {
                        QTC::TC("qpdf", "NNTree erased last kid");
                    }
                }
            } else {
                // Next kid is in deleted kid's position
                QTC::TC("qpdf", "NNTree erased non-last kid");
                deepen(kids.getArrayItem(element->kid_number), true, true);
            }
            done = true;
        } else if (parent == this->path.end()) {
            // We erased the very last item. Convert the root to an empty items array.
            QTC::TC("qpdf", "NNTree non-flat tree is empty after remove");
            element->node.removeKey("/Kids");
            element->node.replaceKey(impl.details.itemsKey(), QPDFObjectHandle::newArray());
            this->path.clear();
            setItemNumber(impl.oh, -1);
            done = true;
        } else {
            // Walk up the tree and continue
            QTC::TC("qpdf", "NNTree remove walking up tree");
            this->path.pop_back();
        }
    }
}